

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

bool __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
contains<char_const*const&>
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,char **item)

{
  enable_if_t<_detail::is_pyobject<bool>::value_&&_detail::move_if_unreferenced<bool>::value,_bool>
  eVar1;
  handle hStack_38;
  str_attr_accessor local_30;
  
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
            (&local_30,
             (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
              *)this,"__contains__");
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&hStack_38,(char **)&local_30);
  eVar1 = cast<bool>((object *)&hStack_38);
  handle::dec_ref(&hStack_38);
  handle::dec_ref(&local_30.cache.super_handle);
  return eVar1;
}

Assistant:

bool object_api<D>::contains(T &&item) const {
    return attr("__contains__")(std::forward<T>(item)).template cast<bool>();
}